

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtsStreamReader.h
# Opt level: O1

void __thiscall DTSStreamReader::DTSStreamReader(DTSStreamReader *this)

{
  SimplePacketizerReader::SimplePacketizerReader(&this->super_SimplePacketizerReader);
  (this->super_SimplePacketizerReader).super_AbstractStreamReader.super_BaseAbstractStreamReader.
  _vptr_BaseAbstractStreamReader = (_func_int **)&PTR__SimplePacketizerReader_00240518;
  this->m_frameDuration = 0.0;
  this->pi_lfeCnt = 0;
  this->hd_pi_lfeCnt = 0;
  this->hd_bitDepth = 0;
  this->pi_channels = '\0';
  this->hd_pi_channels = '\0';
  this->m_hdBitrate = 0;
  this->m_hdType = DTS_SUBTYPE_UNINITIALIZED;
  this->m_state = stDecodeDTS;
  *(undefined8 *)((long)&this->m_state + 3) = 0;
  this->nblks = 0;
  this->i_frame_size = 0;
  this->pi_audio_mode = 0;
  this->pi_sample_rate = 0;
  this->hd_pi_sample_rate = 0;
  this->pi_sample_rate_index = 0;
  this->pi_bit_rate_index = 0;
  this->pi_bit_rate = 0;
  this->m_isCoreExists = true;
  this->m_firstCall = true;
  this->pi_frame_length = 0;
  this->pi_channels_conf = 0;
  *(undefined8 *)&this->m_skippingSamples = 0;
  *(undefined8 *)((long)&this->m_dataSegmentLen + 4) = 0;
  *(undefined8 *)((long)&this->core_ext_mask + 1) = 0;
  return;
}

Assistant:

DTSStreamReader() : nblks(0), i_frame_size(0), pi_audio_mode(0), pi_bit_rate_index(0), pi_channels_conf(0)
    {
        pi_sample_rate_index = 0;
        pi_bit_rate = 0;
        m_dts_hd_mode = false;
        m_downconvertToDTS = false;
        m_useNewStyleAudioPES = false;
        m_state = DTSDecodeState::stDecodeDTS;
        m_hdFrameLen = 0;
        m_frameDuration = 0;
        m_hdType = DTSHD_SUBTYPE::DTS_SUBTYPE_UNINITIALIZED;
        hd_bitDepth = 0;
        hd_pi_lfeCnt = pi_lfeCnt = 0;
        hd_pi_channels = pi_channels = 0;
        m_hdBitrate = 0;
        hd_pi_sample_rate = pi_sample_rate = 0;
        m_isCoreExists = true;
        m_firstCall = true;
        pi_frame_length = 0;  // todo: investigate how to fill it if core absent
        m_skippingSamples = 0;
        m_dataSegmentLen = 0;
        core_ext_mask = 0;
        m_dtsEsChannels = 0;
        m_testMode = false;
    }